

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O3

void __thiscall imrt::ACO::~ACO(ACO *this)

{
  Ant *this_00;
  pointer ppAVar1;
  long lVar2;
  
  this->_vptr_ACO = (_func_int **)&PTR__ACO_0013cbf8;
  if (0 < this->n_ants) {
    lVar2 = 0;
    do {
      this_00 = (this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar2];
      if (this_00 != (Ant *)0x0) {
        Ant::~Ant(this_00);
      }
      operator_delete(this_00);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->n_ants);
  }
  ppAVar1 = (this->ants).super__Vector_base<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar1 != (pointer)0x0) {
    operator_delete(ppAVar1);
  }
  std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::~vector(&this->iprobability);
  std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::~vector(&this->iheuristic);
  std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::~vector(&this->ipheromone);
  std::
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  ::~vector(&this->probability);
  std::
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  ::~vector(&this->heuristic);
  std::
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  ::~vector(&this->pheromone);
  return;
}

Assistant:

virtual ~ACO() {
    for (int i=0; i < n_ants; i++) {
       delete ants[i];
    }
  }